

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

bool __thiscall wasm::anon_unknown_0::TypeMerging::merge(TypeMerging *this,MergeKind kind)

{
  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  vector<wasm::HeapType,std::allocator<wasm::HeapType>> *this_01;
  _Hash_node_base *p_Var1;
  pointer pFVar2;
  long lVar3;
  _Hash_node_base *p_Var4;
  pointer pHVar5;
  iterator __position;
  anon_struct_8_0_00000001_for___align aVar6;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
  *p_Var7;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
  *this_02;
  _Storage<wasm::HeapType,_true> _Var8;
  __node_base_ptr p_Var9;
  undefined8 uVar10;
  value_type vVar11;
  Shareability SVar12;
  HeapTypeKind HVar13;
  SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
  *this_03;
  const_iterator cVar14;
  size_t sVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  _Hash_node_base *p_Var18;
  size_t *__s;
  size_t *psVar19;
  size_t sVar20;
  Struct *pSVar21;
  pointer pFVar22;
  _Hash_node_base _Var23;
  _Hash_node_base *p_Var24;
  _List_node_base *p_Var25;
  iterator iVar26;
  uint *puVar27;
  _Storage<wasm::HeapType,_true> *p_Var28;
  ulong uVar29;
  __buckets_ptr __n;
  ulong uVar30;
  undefined1 auVar31 [8];
  _Storage<wasm::HeapType,_true> _Var32;
  _Hash_node_base *p_Var33;
  _Hash_node_base *p_Var34;
  __node_ptr __n_00;
  ulong uVar35;
  char *msg;
  _Hash_node_base *p_Var36;
  uint uVar37;
  long lVar38;
  pointer p_Var39;
  long lVar40;
  anon_struct_8_0_00000001_for___align aVar41;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *partition;
  _Storage<wasm::HeapType,_true> _Var42;
  HeapType HVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  Signature SVar46;
  optional<wasm::HeapType> oVar47;
  initializer_list<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> __l;
  initializer_list<wasm::HeapType> __l_00;
  undefined1 local_270 [8];
  unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
  typePartitions;
  optional<wasm::HeapType> super;
  undefined1 local_208 [8];
  Partitions partitions;
  anon_class_24_3_64d2c6ff ensurePartition;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  newPartitions;
  _Storage<wasm::HeapType,_true> local_1b0;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  partitionIndices;
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  dfa;
  HeapType local_158;
  HeapType type_1;
  undefined1 auStack_148 [8];
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  split;
  size_t *local_128;
  unordered_map<std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>,_std::hash<std::optional<wasm::HeapType>_>,_std::equal_to<std::optional<wasm::HeapType>_>,_std::allocator<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>_>_>
  shapePartitions;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_e8;
  _Hash_node_base *local_d0;
  pointer __ptr_3;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  refinedPartitions;
  undefined1 auStack_a8 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> newMergeable;
  allocator_type local_69 [17];
  _Storage<wasm::HeapType,_true> _Stack_58;
  value_type target;
  long local_48;
  
  local_208 = (undefined1  [8])local_208;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_270 = (undefined1  [8])&typePartitions._M_h._M_rehash_policy._M_next_resize;
  typePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  typePartitions._M_h._M_bucket_count = 0;
  typePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  typePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  typePartitions._M_h._M_rehash_policy._4_4_ = 0;
  typePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_128 = &shapePartitions._M_h._M_rehash_policy._M_next_resize;
  shapePartitions._M_h._M_buckets = (__buckets_ptr)0x1;
  shapePartitions._M_h._M_bucket_count = 0;
  shapePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  shapePartitions._M_h._M_element_count._0_4_ = 0x3f800000;
  shapePartitions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  shapePartitions._M_h._M_rehash_policy._4_4_ = 0;
  shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node._M_size = (size_t)local_270;
  partitions.
  super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_208;
  ensurePartition.typePartitions =
       (unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>
        *)local_208;
  ensurePartition.partitions = (Partitions *)this;
  local_69._1_8_ = this;
  mergeableSupertypesFirst
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_1b0._M_value,this,
             &this->mergeable);
  type_1.id = (uintptr_t)partitionIndices._M_h._M_buckets;
  if (local_1b0 != (_Storage<wasm::HeapType,_true>)partitionIndices._M_h._M_buckets) {
    refinedPartitions.
    super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_69._1_8_ + 0x60);
    this_03 = (SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
               *)(local_69._1_8_ + 0x98);
    _Var42 = local_1b0;
    do {
      local_e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)_Var42;
      _Stack_58 = (_Storage<wasm::HeapType,_true>)0x0;
      target.id = 0;
      local_48 = 0;
      __ptr_3 = (pointer)local_e8.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start;
      HeapType::getHeapTypeChildren
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_a8,
                 (HeapType *)&local_e8);
      pHVar5 = newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (auVar31 = auStack_a8; auVar31 != (undefined1  [8])pHVar5;
          auVar31 = (undefined1  [8])((long)auVar31 + 8)) {
        partitionIndices._M_h._M_single_bucket = ((_Hash_node_base *)auVar31)->_M_nxt;
        if (((__node_base_ptr)0x7c < partitionIndices._M_h._M_single_bucket) &&
           (cVar14 = std::
                     _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)refinedPartitions.
                               super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)&partitionIndices._M_h._M_single_bucket),
           cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0)) {
          if (target.id == 0) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&_Stack_58._M_value,
                       (iterator)0x0,(HeapType *)&partitionIndices._M_h._M_single_bucket);
          }
          else {
            *(__node_base_ptr *)target.id = partitionIndices._M_h._M_single_bucket;
            target.id = target.id + 8;
          }
        }
      }
      _Var32 = _Stack_58;
      _Var8 = (_Storage<wasm::HeapType,_true>)target.id;
      if (auStack_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_a8,
                        (long)newMergeable.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
        _Var32 = _Stack_58;
        _Var8 = (_Storage<wasm::HeapType,_true>)target;
      }
      for (; _Var32 != _Var8; _Var32 = (_Storage<wasm::HeapType,_true>)((long)_Var32 + 8)) {
        merge::anon_class_24_3_64d2c6ff::operator()
                  ((anon_class_24_3_64d2c6ff *)
                   &partitions.
                    super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                    ._M_impl._M_node._M_size,(HeapType)*(_Hash_node_base **)_Var32);
      }
      if (_Stack_58 != (_Storage<wasm::HeapType,_true>)0x0) {
        operator_delete((void *)_Stack_58,-(long)_Stack_58);
      }
      sVar15 = SmallSetBase<wasm::HeapType,_5UL,_wasm::UnorderedFixedStorage<wasm::HeapType,_5UL>,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>
               ::count(this_03,(HeapType *)&__ptr_3);
      if ((sVar15 == 0) &&
         (cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)refinedPartitions.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&__ptr_3
                         ),
         cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)) {
        if (kind == Supertypes) {
          oVar47 = HeapType::getDeclaredSuperType((HeapType *)&__ptr_3);
          if ((((undefined1  [16])
                oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
               (undefined1  [16])0x0) ||
             (bVar44 = shapeEq((HeapType)__ptr_3,
                               oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_payload._M_value),
             !bVar44)) {
            merge::anon_class_24_3_64d2c6ff::operator()
                      ((anon_class_24_3_64d2c6ff *)
                       &partitions.
                        super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                        ._M_impl._M_node._M_size,(HeapType)__ptr_3);
            goto LAB_00ae3140;
          }
          iVar16 = merge::anon_class_24_3_64d2c6ff::operator()
                             ((anon_class_24_3_64d2c6ff *)
                              &partitions.
                               super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                               ._M_impl._M_node._M_size,
                              oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
          makeDFAState((State<wasm::HeapType> *)auStack_a8,(TypeMerging *)local_69._1_8_,
                       (HeapType)__ptr_3);
          std::
          vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
          ::emplace_back<wasm::DFA::State<wasm::HeapType>>
                    ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                      *)(iVar16._M_node + 1),(State<wasm::HeapType> *)auStack_a8);
          if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(newMergeable.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          pmVar17 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_270,(key_type *)&__ptr_3);
        }
        else {
          partitionIndices._M_h._M_single_bucket = &__ptr_3->super__Hash_node_base;
          oVar47 = HeapType::getDeclaredSuperType
                             ((HeapType *)&partitionIndices._M_h._M_single_bucket);
          _Stack_58 = oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_payload;
          target.id._0_1_ =
               oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_engaged;
          if (((undefined1  [16])
               oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_58._M_value = getMerged((TypeMerging *)local_69._1_8_,_Stack_58._M_value);
            if ((byte)target.id == '\0') {
              target.id._0_1_ = 1;
            }
          }
          p_Var33 = (_Hash_node_base *)0xfffffffffffff2fb;
          if ((byte)target.id == '\x01') {
            p_Var33 = (_Hash_node_base *)
                      std::hash<wasm::HeapType>::operator()
                                ((hash<wasm::HeapType> *)auStack_a8,&_Stack_58._M_value);
          }
          uVar29 = (ulong)p_Var33 % (ulong)shapePartitions._M_h._M_buckets;
          p_Var18 = (_Hash_node_base *)local_128[uVar29];
          p_Var36 = (_Hash_node_base *)0x0;
          if (p_Var18 != (_Hash_node_base *)0x0) {
            p_Var34 = p_Var18->_M_nxt;
            do {
              if (p_Var34[10]._M_nxt == p_Var33) {
                bVar44 = (byte)target.id == *(byte *)&p_Var34[2]._M_nxt;
                if ((bVar44 & (byte)target.id) == 1) {
                  bVar44 = _Stack_58 == *(_Storage<wasm::HeapType,_true> *)(p_Var34 + 1);
                }
                p_Var36 = p_Var18;
                if (bVar44) break;
              }
              p_Var1 = p_Var34->_M_nxt;
              if (p_Var1 == (_Hash_node_base *)0x0) {
                p_Var36 = (_Hash_node_base *)0x0;
                break;
              }
              p_Var36 = (_Hash_node_base *)0x0;
              p_Var18 = p_Var34;
              p_Var34 = p_Var1;
            } while ((ulong)p_Var1[10]._M_nxt % (ulong)shapePartitions._M_h._M_buckets == uVar29);
          }
          if (p_Var36 == (_Hash_node_base *)0x0) {
            p_Var18 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var18 = p_Var36->_M_nxt;
          }
          shapePartitions._M_h._M_single_bucket = (__node_base_ptr)_Var42;
          if (p_Var18 == (_Hash_node_base *)0x0) {
            p_Var18 = (_Hash_node_base *)operator_new(0x58);
            p_Var18->_M_nxt = (_Hash_node_base *)0x0;
            p_Var18[1]._M_nxt = (_Hash_node_base *)_Stack_58;
            p_Var18[2]._M_nxt = (_Hash_node_base *)target.id;
            p_Var18[3]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[4]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[7]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[8]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[9]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[3]._M_nxt = p_Var18 + 9;
            p_Var18[4]._M_nxt = (_Hash_node_base *)0x1;
            p_Var18[5]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[6]._M_nxt = (_Hash_node_base *)0x0;
            *(undefined4 *)&p_Var18[7]._M_nxt = 0x3f800000;
            p_Var18[8]._M_nxt = (_Hash_node_base *)0x0;
            p_Var18[9]._M_nxt = (_Hash_node_base *)0x0;
            auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)&shapePartitions._M_h._M_element_count,
                                 (ulong)shapePartitions._M_h._M_buckets,
                                 (ulong)shapePartitions._M_h._M_before_begin._M_nxt);
            __n = auVar45._8_8_;
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (__n == (__buckets_ptr)0x1) {
                shapePartitions._M_h._M_rehash_policy._M_next_resize = 0;
                __s = &shapePartitions._M_h._M_rehash_policy._M_next_resize;
              }
              else {
                __s = (size_t *)
                      __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_a8,
                                 (size_type)__n,(void *)0x0);
                memset(__s,0,(long)__n * 8);
              }
              _Var23._M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
              shapePartitions._M_h._M_bucket_count = 0;
              if (_Var23._M_nxt != (_Hash_node_base *)0x0) {
                uVar29 = 0;
                do {
                  p_Var36 = (_Var23._M_nxt)->_M_nxt;
                  uVar30 = (ulong)_Var23._M_nxt[10]._M_nxt % (ulong)__n;
                  if ((_Hash_node_base *)__s[uVar30] == (_Hash_node_base *)0x0) {
                    (_Var23._M_nxt)->_M_nxt =
                         (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
                    shapePartitions._M_h._M_bucket_count = (size_type)_Var23._M_nxt;
                    __s[uVar30] = (size_t)&shapePartitions._M_h._M_bucket_count;
                    if ((_Var23._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                      psVar19 = __s + uVar29;
                      goto LAB_00ae344a;
                    }
                  }
                  else {
                    (_Var23._M_nxt)->_M_nxt = ((_Hash_node_base *)__s[uVar30])->_M_nxt;
                    psVar19 = (size_t *)__s[uVar30];
                    uVar30 = uVar29;
LAB_00ae344a:
                    *psVar19 = (size_t)_Var23._M_nxt;
                  }
                  _Var23._M_nxt = p_Var36;
                  uVar29 = uVar30;
                } while (p_Var36 != (_Hash_node_base *)0x0);
              }
              if (&shapePartitions._M_h._M_rehash_policy._M_next_resize != local_128) {
                operator_delete(local_128,(long)shapePartitions._M_h._M_buckets << 3);
              }
              uVar29 = (ulong)p_Var33 % (ulong)__n;
              local_128 = __s;
              shapePartitions._M_h._M_buckets = __n;
            }
            p_Var18[10]._M_nxt = p_Var33;
            if ((_Hash_node_base *)local_128[uVar29] == (_Hash_node_base *)0x0) {
              p_Var18->_M_nxt = (_Hash_node_base *)shapePartitions._M_h._M_bucket_count;
              if (shapePartitions._M_h._M_bucket_count != 0) {
                local_128[*(ulong *)(shapePartitions._M_h._M_bucket_count + 0x50) %
                          (ulong)shapePartitions._M_h._M_buckets] = (size_t)p_Var18;
              }
              local_128[uVar29] = (size_t)&shapePartitions._M_h._M_bucket_count;
              shapePartitions._M_h._M_bucket_count = (size_type)p_Var18;
            }
            else {
              p_Var18->_M_nxt = ((_Hash_node_base *)local_128[uVar29])->_M_nxt;
              ((_Hash_node_base *)local_128[uVar29])->_M_nxt = p_Var18;
            }
            shapePartitions._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(shapePartitions._M_h._M_before_begin._M_nxt)->_M_nxt + 1);
          }
          p_Var9 = partitionIndices._M_h._M_single_bucket;
          p_Var18 = p_Var18 + 3;
          local_d0 = (_Hash_node_base *)operator_new(0x20);
          local_d0->_M_nxt = (_Hash_node_base *)0x0;
          local_d0[1]._M_nxt = p_Var9;
          local_d0[2]._M_nxt = (_Hash_node_base *)local_208;
          local_e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)p_Var9;
          bVar44 = HeapType::isOpen((HeapType *)&local_e8);
          SVar12 = HeapType::getShared((HeapType *)&local_e8);
          HVar13 = HeapType::getKind((HeapType *)&local_e8);
          lVar38 = -0x61c8864680b583ea;
          if (SVar12 != Shared) {
            lVar38 = -0x61c8864680b583eb;
          }
          if (3 < HVar13 - Func) {
            uVar37 = 0x259;
            msg = "unexpected kind";
LAB_00ae3ffb:
            handle_unreachable(msg,
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/TypeMerging.cpp"
                               ,uVar37);
          }
          local_69._9_8_ = p_Var18;
          switch(HVar13) {
          case Func:
            SVar46 = HeapType::getSignature((HeapType *)&local_e8);
            sVar15 = shapeHash(SVar46.params.id);
            sVar20 = shapeHash(SVar46.results.id);
            uVar29 = (sVar15 >> 4) + sVar20 + sVar15 * 0x1000 + -0x61c8864680b583eb ^ sVar15;
            break;
          case Struct:
            pSVar21 = HeapType::getStruct((HeapType *)&local_e8);
            pFVar22 = (pSVar21->fields).
                      super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pFVar2 = (pSVar21->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar29 = (long)pFVar2 - (long)pFVar22 >> 4;
            if (pFVar2 != pFVar22) {
              lVar40 = 8;
              uVar30 = 0;
              do {
                lVar3 = *(long *)((long)&(pFVar22->type).id + lVar40);
                sVar15 = shapeHash((Type)*(uintptr_t *)((long)pFVar22 + lVar40 + -8));
                uVar35 = (ulong)(int)lVar3;
                uVar35 = (uVar35 >> 4) + uVar35 * 0x1000 + (lVar3 >> 0x20) + -0x61c8864680b583eb ^
                         uVar35;
                uVar29 = uVar29 ^ uVar29 * 0x1000 + -0x61c8864680b583eb + (uVar29 >> 4) +
                                  (sVar15 + 0x9e3779b97f4a7c15 + uVar35 * 0x1000 + (uVar35 >> 4) ^
                                  uVar35);
                uVar30 = uVar30 + 1;
                pFVar22 = (pSVar21->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar40 = lVar40 + 0x10;
              } while (uVar30 < (ulong)((long)(pSVar21->fields).
                                              super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pFVar22 >> 4));
            }
            break;
          case Array:
            HeapType::getArray((HeapType *)auStack_a8);
            pHVar5 = newMergeable.
                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar15 = shapeHash((Type)auStack_a8);
            uVar29 = (ulong)(int)pHVar5;
            uVar29 = (uVar29 >> 4) + uVar29 * 0x1000 + ((long)pHVar5 >> 0x20) + -0x61c8864680b583eb
                     ^ uVar29;
            uVar29 = sVar15 + 0x9e3779b97f4a7c15 + uVar29 * 0x1000 + (uVar29 >> 4) ^ uVar29;
            break;
          case Cont:
            uVar37 = 0x255;
            msg = "TODO: cont";
            goto LAB_00ae3ffb;
          }
          uVar10 = local_69._9_8_;
          uVar35 = lVar38 + (ulong)bVar44 * 0x1000;
          uVar30 = bVar44 ^ uVar35;
          uVar30 = (uVar35 >> 4) + 0x9e3779b97f4a7c15 + uVar30 * 0x1000 + (long)(int)HVar13 ^ uVar30
          ;
          p_Var36 = (_Hash_node_base *)
                    (uVar30 * 0x1000 + -0x61c8864680b583eb + (uVar30 >> 4) + uVar29 ^ uVar30);
          uVar29 = (ulong)p_Var36 % (ulong)((_Hash_node_base *)(local_69._9_8_ + 8))->_M_nxt;
          p_Var33 = (*(_Hash_node_base **)local_69._9_8_)[uVar29]._M_nxt;
          p_Var18 = (_Hash_node_base *)0x0;
          if (p_Var33 != (_Hash_node_base *)0x0) {
            p_Var34 = p_Var33->_M_nxt;
            do {
              p_Var18 = p_Var33;
              p_Var33 = p_Var34;
              if ((p_Var33[3]._M_nxt == p_Var36) &&
                 (bVar44 = shapeEq((HeapType)local_d0[1]._M_nxt,(HeapType)p_Var33[1]._M_nxt), bVar44
                 )) break;
              p_Var34 = p_Var33->_M_nxt;
              if (p_Var34 == (_Hash_node_base *)0x0) {
                p_Var18 = (_Hash_node_base *)0x0;
                break;
              }
              p_Var18 = (_Hash_node_base *)0x0;
            } while ((ulong)p_Var34[3]._M_nxt % (ulong)((_Hash_node_base *)(uVar10 + 8))->_M_nxt ==
                     uVar29);
          }
          if (p_Var18 == (_Hash_node_base *)0x0) {
            p_Var33 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var33 = p_Var18->_M_nxt;
          }
          p_Var18 = p_Var33;
          p_Var34 = local_d0;
          if (p_Var33 == (_Hash_node_base *)0x0) {
            auVar45 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                ((ulong)(local_69._9_8_ + 0x20),
                                 (ulong)((_Hash_node_base *)(local_69._9_8_ + 8))->_M_nxt,
                                 (ulong)((_Hash_node_base *)(local_69._9_8_ + 0x18))->_M_nxt);
            p_Var18 = auVar45._8_8_;
            if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (p_Var18 == (_Hash_node_base *)0x1) {
                _Var23._M_nxt = (_Hash_node_base *)(local_69._9_8_ + 0x30);
                ((_Hash_node_base *)(local_69._9_8_ + 0x30))->_M_nxt = (_Hash_node_base *)0x0;
              }
              else {
                _Var23._M_nxt =
                     (_Hash_node_base *)
                     __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                               ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_a8,
                                p_Var18,(void *)0x0);
                memset(_Var23._M_nxt,0,(long)p_Var18 * 8);
              }
              uVar10 = local_69._9_8_;
              p_Var34 = ((_Hash_node_base *)(local_69._9_8_ + 0x10))->_M_nxt;
              ((_Hash_node_base *)(local_69._9_8_ + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
              if (p_Var34 != (_Hash_node_base *)0x0) {
                p_Var1 = (_Hash_node_base *)(local_69._9_8_ + 0x10);
                uVar29 = 0;
                do {
                  p_Var4 = p_Var34->_M_nxt;
                  uVar30 = (ulong)p_Var34[3]._M_nxt % (ulong)p_Var18;
                  if (_Var23._M_nxt[uVar30]._M_nxt == (_Hash_node_base *)0x0) {
                    p_Var34->_M_nxt = p_Var1->_M_nxt;
                    p_Var1->_M_nxt = p_Var34;
                    _Var23._M_nxt[uVar30]._M_nxt = p_Var1;
                    if (p_Var34->_M_nxt != (_Hash_node_base *)0x0) {
                      p_Var24 = _Var23._M_nxt + uVar29;
                      goto LAB_00ae38dc;
                    }
                  }
                  else {
                    p_Var34->_M_nxt = (_Var23._M_nxt[uVar30]._M_nxt)->_M_nxt;
                    p_Var24 = _Var23._M_nxt[uVar30]._M_nxt;
                    uVar30 = uVar29;
LAB_00ae38dc:
                    p_Var24->_M_nxt = p_Var34;
                  }
                  p_Var34 = p_Var4;
                  uVar29 = uVar30;
                } while (p_Var4 != (_Hash_node_base *)0x0);
              }
              if ((_Hash_node_base *)(local_69._9_8_ + 0x30) != *(_Hash_node_base **)local_69._9_8_)
              {
                operator_delete(*(_Hash_node_base **)local_69._9_8_,
                                (long)((_Hash_node_base *)(local_69._9_8_ + 8))->_M_nxt << 3);
              }
              ((_Hash_node_base *)(uVar10 + 8))->_M_nxt = p_Var18;
              *(_Hash_node_base **)uVar10 = _Var23._M_nxt;
              uVar29 = (ulong)p_Var36 % (ulong)p_Var18;
            }
            local_d0[3]._M_nxt = p_Var36;
            _Var23._M_nxt = *(_Hash_node_base **)local_69._9_8_;
            if (_Var23._M_nxt[uVar29]._M_nxt == (_Hash_node_base *)0x0) {
              p_Var18 = ((_Hash_node_base *)(local_69._9_8_ + 0x10))->_M_nxt;
              local_d0->_M_nxt = p_Var18;
              ((_Hash_node_base *)(local_69._9_8_ + 0x10))->_M_nxt = local_d0;
              if (p_Var18 != (_Hash_node_base *)0x0) {
                _Var23._M_nxt
                [(ulong)p_Var18[3]._M_nxt % (ulong)((_Hash_node_base *)(local_69._9_8_ + 8))->_M_nxt
                ]._M_nxt = local_d0;
              }
              (*(_Hash_node_base **)local_69._9_8_)[uVar29]._M_nxt =
                   (_Hash_node_base *)(local_69._9_8_ + 0x10);
            }
            else {
              local_d0->_M_nxt = (_Var23._M_nxt[uVar29]._M_nxt)->_M_nxt;
              (_Var23._M_nxt[uVar29]._M_nxt)->_M_nxt = local_d0;
            }
            ((_Hash_node_base *)(local_69._9_8_ + 0x18))->_M_nxt =
                 (_Hash_node_base *)
                 ((long)&((_Hash_node_base *)(local_69._9_8_ + 0x18))->_M_nxt->_M_nxt + 1);
            p_Var18 = local_d0;
            p_Var34 = (_Hash_node_base *)0x0;
          }
          _Var42 = (_Storage<wasm::HeapType,_true>)shapePartitions._M_h._M_single_bucket;
          if (p_Var34 != (_Hash_node_base *)0x0) {
            operator_delete(p_Var34,0x20);
          }
          if (p_Var33 == (_Hash_node_base *)0x0) {
            auStack_a8 = (undefined1  [8])0x0;
            newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            p_Var25 = (_List_node_base *)operator_new(0x28);
            p_Var25[1]._M_next = (_List_node_base *)auStack_a8;
            p_Var25[1]._M_prev =
                 (_List_node_base *)
                 newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            p_Var25[2]._M_next =
                 (_List_node_base *)
                 newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            auStack_a8 = (undefined1  [8])0x0;
            newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var25);
            partitions.
            super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&(partitions.
                          super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
            p_Var18[2]._M_nxt = (_Hash_node_base *)p_Var25;
            std::
            vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
            ::~vector((vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>
                       *)auStack_a8);
          }
          iVar16._M_node = (_List_node_base *)p_Var18[2]._M_nxt;
          makeDFAState((State<wasm::HeapType> *)auStack_a8,(TypeMerging *)local_69._1_8_,
                       (HeapType)__ptr_3);
          std::
          vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
          ::emplace_back<wasm::DFA::State<wasm::HeapType>>
                    ((vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>
                      *)(iVar16._M_node + 1),(State<wasm::HeapType> *)auStack_a8);
          if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(newMergeable.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          pmVar17 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_270,(key_type *)&__ptr_3);
        }
        pmVar17->_M_node = iVar16._M_node;
      }
      else {
        merge::anon_class_24_3_64d2c6ff::operator()
                  ((anon_class_24_3_64d2c6ff *)
                   &partitions.
                    super__List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
                    ._M_impl._M_node._M_size,(HeapType)__ptr_3);
      }
LAB_00ae3140:
      _Var42 = (_Storage<wasm::HeapType,_true>)((long)_Var42 + 8);
    } while (_Var42 != (_Storage<wasm::HeapType,_true>)type_1.id);
  }
  if (local_1b0 != (_Storage<wasm::HeapType,_true>)0x0) {
    operator_delete((void *)local_1b0,partitionIndices._M_h._M_bucket_count - (long)local_1b0);
  }
  std::
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
  ::
  vector<std::move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>,void>
            ((vector<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>,std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,std::allocator<wasm::DFA::State<wasm::HeapType>>>>>
              *)&partitionIndices._M_h._M_single_bucket,
             (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              )local_208,
             (move_iterator<std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              )local_208,(allocator_type *)auStack_a8);
  DFA::refinePartitions<wasm::HeapType>
            ((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
              *)&__ptr_3,
             (vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              *)&partitionIndices._M_h._M_single_bucket);
  if (kind == Supertypes) {
    ensurePartition.this = (TypeMerging *)0x0;
    if (__ptr_3 !=
        (pointer)refinedPartitions.
                 super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      type_1.id = (uintptr_t)
                  refinedPartitions.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      p_Var39 = __ptr_3;
      HVar43.id = (uintptr_t)
                  refinedPartitions.
                  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        pHVar5 = (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  &p_Var39->super__Hash_node_base)->_M_impl).super__Vector_impl_data._M_start;
        aVar41 = (p_Var39->
                 super__Hash_node_value<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
                 ._M_storage._M_storage.__align;
        if ((long)aVar41 - (long)pHVar5 == 8) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_a8,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)p_Var39);
          __l._M_len = 1;
          __l._M_array = (iterator)auStack_a8;
          std::
          vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ::vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                    *)auStack_148,__l,(allocator_type *)&local_1b0._M_value);
          if (auStack_a8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_a8,
                            (long)newMergeable.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
          }
        }
        else {
          std::
          _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)auStack_a8,pHVar5,aVar41,0,&local_1b0,&_Stack_58,&local_e8);
          auStack_148 = (undefined1  [8])0x0;
          split.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          split.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1b0 = (_Storage<wasm::HeapType,_true>)
                      &partitionIndices._M_h._M_rehash_policy._M_next_resize;
          partitionIndices._M_h._M_buckets = (__buckets_ptr)0x1;
          partitionIndices._M_h._M_bucket_count = 0;
          partitionIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          partitionIndices._M_h._M_element_count._0_4_ = 0x3f800000;
          partitionIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          partitionIndices._M_h._M_rehash_policy._4_4_ = 0;
          partitionIndices._M_h._M_rehash_policy._M_next_resize = 0;
          refinedPartitions.
          super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var39;
          mergeableSupertypesFirst
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&_Stack_58._M_value,
                     (TypeMerging *)local_69._1_8_,
                     (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)p_Var39);
          vVar11 = target;
          for (_Var42 = _Stack_58; _Var42 != (_Storage<wasm::HeapType,_true>)vVar11.id;
              _Var42 = (_Storage<wasm::HeapType,_true>)((long)_Var42 + 8)) {
            local_158.id = *(uintptr_t *)_Var42;
            oVar47 = HeapType::getDeclaredSuperType(&local_158);
            typePartitions._M_h._M_single_bucket =
                 oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
                 oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_engaged;
            if ((((undefined1  [16])
                  oVar47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
                 (undefined1  [16])0x0) ||
               (cVar14 = std::
                         _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)auStack_a8,(key_type *)&typePartitions._M_h._M_single_bucket),
               cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0))
            {
              lVar38 = (long)split.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_148;
              super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._8_8_ = local_158.id;
              __l_00._M_len = 1;
              __l_00._M_array =
                   (iterator)
                   &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::HeapType>._M_engaged;
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                        (&local_e8,__l_00,local_69);
              std::
              vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ::emplace_back<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                        ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                          *)auStack_148,&local_e8);
              if ((_Hash_node_base *)
                  local_e8.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start != (_Hash_node_base *)0x0) {
                operator_delete(local_e8.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_e8.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_e8.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              puVar27 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&local_1b0._M_value,&local_158);
              uVar37 = (int)(lVar38 >> 3) * -0x55555555;
            }
            else {
              iVar26 = std::
                       _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&local_1b0._M_value,
                              (key_type *)&typePartitions._M_h._M_single_bucket);
              if (iVar26.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                  _M_cur == (__node_type *)0x0) {
                std::__throw_out_of_range("_Map_base::at");
              }
              uVar37 = *(uint *)((long)iVar26.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                       ._M_cur + 0x10);
              this_01 = (vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
                        ((long)auStack_148 + (ulong)uVar37 * 0x18);
              __position._M_current = *(HeapType **)(this_01 + 8);
              if (__position._M_current == *(HeapType **)(this_01 + 0x10)) {
                std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
                _M_realloc_insert<wasm::HeapType_const&>(this_01,__position,&local_158);
              }
              else {
                (__position._M_current)->id = local_158.id;
                *(HeapType **)(this_01 + 8) = __position._M_current + 1;
              }
              puVar27 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&local_1b0._M_value,&local_158);
            }
            *puVar27 = uVar37;
          }
          if (_Stack_58 != (_Storage<wasm::HeapType,_true>)0x0) {
            operator_delete((void *)_Stack_58,local_48 - (long)_Stack_58);
          }
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_1b0._M_value);
          std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)auStack_a8);
          p_Var39 = (pointer)refinedPartitions.
                             super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
          HVar43 = type_1;
        }
        std::
        vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>*,std::vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>
                  ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    *)&ensurePartition.this,0,auStack_148);
        std::
        vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
        ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                   *)auStack_148);
        p_Var39 = (pointer)&(p_Var39->
                            super__Hash_node_value<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>
                            ).super__Hash_node_code_cache<true>;
      } while (p_Var39 != (pointer)HVar43.id);
    }
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::operator=((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)&__ptr_3,
                (vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 *)&ensurePartition.this);
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               *)&ensurePartition.this);
  }
  auStack_a8 = (undefined1  [8])0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refinedPartitions.
  super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       refinedPartitions.
       super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__ptr_3 ==
      (pointer)refinedPartitions.
               super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    bVar44 = false;
  }
  else {
    this_00 = (_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)(local_69._1_8_ + 0x118);
    bVar44 = false;
    p_Var39 = __ptr_3;
    do {
      mergeableSupertypesFirst
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_1b0._M_value,
                 (TypeMerging *)local_69._1_8_,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)p_Var39);
      _Stack_58 = *(_Storage<wasm::HeapType,_true> *)local_1b0;
      operator_delete((void *)local_1b0,partitionIndices._M_h._M_bucket_count - (long)local_1b0);
      if (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
        _M_realloc_insert<wasm::HeapType_const&>
                  ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)auStack_a8,
                   (iterator)
                   newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_start,&_Stack_58._M_value);
      }
      else {
        (newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start)->id = (uintptr_t)_Stack_58;
        newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      aVar6 = (p_Var39->
              super__Hash_node_value<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>
              ).
              super__Hash_node_value_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>
              ._M_storage._M_storage.__align;
      for (aVar41 = (anon_struct_8_0_00000001_for___align)
                    (((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &p_Var39->super__Hash_node_base)->_M_impl).super__Vector_impl_data._M_start;
          aVar41 != aVar6; aVar41 = (anon_struct_8_0_00000001_for___align)((long)aVar41 + 8)) {
        local_1b0 = *(_Storage<wasm::HeapType,_true> *)aVar41;
        if (local_1b0 != _Stack_58) {
          p_Var28 = (_Storage<wasm::HeapType,_true> *)
                    std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](this_00,&local_1b0._M_value);
          *p_Var28 = _Stack_58;
          bVar44 = true;
        }
      }
      p_Var39 = (pointer)&(p_Var39->
                          super__Hash_node_value<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_true>
                          ).super__Hash_node_code_cache<true>;
    } while (p_Var39 !=
             (pointer)refinedPartitions.
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  __n_00 = (__node_ptr)auStack_a8;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_move_assign(&this->mergeable);
  if (auStack_a8 != (undefined1  [8])0x0) {
    __n_00 = (__node_ptr)
             ((long)newMergeable.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
    operator_delete((void *)auStack_a8,(ulong)__n_00);
  }
  std::
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ::~vector((vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             *)&__ptr_3);
  std::
  vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ::~vector((vector<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
             *)&partitionIndices._M_h._M_single_bucket);
  this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
             *)shapePartitions._M_h._M_bucket_count;
  while (this_02 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
          *)0x0) {
    p_Var7 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
               **)this_02;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::optional<wasm::HeapType>,_std::unordered_map<wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>,_wasm::(anonymous_namespace)::ShapeHash,_wasm::(anonymous_namespace)::ShapeEq,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>_>_>,_true>_>_>
    ::_M_deallocate_node(this_02,__n_00);
    this_02 = p_Var7;
  }
  memset(local_128,0,(long)shapePartitions._M_h._M_buckets << 3);
  shapePartitions._M_h._M_bucket_count = 0;
  shapePartitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  if (&shapePartitions._M_h._M_rehash_policy._M_next_resize != local_128) {
    operator_delete(local_128,(long)shapePartitions._M_h._M_buckets << 3);
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_270);
  std::__cxx11::
  _List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
  ::_M_clear((_List_base<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>,_std::allocator<std::vector<wasm::DFA::State<wasm::HeapType>,_std::allocator<wasm::DFA::State<wasm::HeapType>_>_>_>_>
              *)local_208);
  return bVar44;
}

Assistant:

bool TypeMerging::merge(MergeKind kind) {
  // Initial partitions are formed by grouping types with their structurally
  // similar supertypes or siblings, according to the `kind`.
  Partitions partitions;

#if TYPE_MERGING_DEBUG
  auto printedPrivateTypes = ModuleUtils::getPrivateHeapTypes(*module);
  using Fallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  Fallback printPrivate(printedPrivateTypes, "private.");
  ModuleTypeNameGenerator<Fallback> print(*module, printPrivate);
  auto dumpPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : partitions) {
      std::cerr << i++ << ": " << print(partition[0].val) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j].val) << "\n";
      }
      std::cerr << "\n";
    }
  };

#endif // TYPE_MERGING_DEBUG

  // Map each type to its partition in the list.
  std::unordered_map<HeapType, Partitions::iterator> typePartitions;

  // Map the supertypes and top-level structures of each type to partitions so
  // that siblings that refine the supertype in the same way can be assigned to
  // the same partition and potentially merged.
  std::unordered_map<
    std::optional<HeapType>,
    std::unordered_map<HeapType, Partitions::iterator, ShapeHash, ShapeEq>>
    shapePartitions;

  // Ensure the type has a partition and return a reference to it. Since we
  // merge up the type tree and visit supertypes first, the partition usually
  // already exists. The exception is when the supertype is public, in which
  // case we might not have created a partition for it yet.
  auto ensurePartition = [&](HeapType type) -> Partitions::iterator {
    auto [it, inserted] = typePartitions.insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), {makeDFAState(type)});
    }
    return it->second;
  };

  // Similar to the above, but look up or create a partition associated with the
  // type's supertype and top-level shape rather than its identity.
  auto ensureShapePartition = [&](HeapType type) -> Partitions::iterator {
    auto super = type.getDeclaredSuperType();
    if (super) {
      super = getMerged(*super);
    }
    auto [it, inserted] =
      shapePartitions[super].insert({type, partitions.end()});
    if (inserted) {
      it->second = partitions.insert(partitions.end(), Partition{});
    }
    return it->second;
  };

  // For each type, either create a new partition or add to its supertype's
  // partition.
  for (auto type : mergeableSupertypesFirst(mergeable)) {
    // We need partitions for any public children of this type since those
    // children will participate in the DFA we're creating.
    for (auto child : getPublicChildren(type)) {
      ensurePartition(child);
    }
    // If the type is distinguished by the module or public, we cannot merge it,
    // so create a new partition for it.
    if (castTypes.count(type) || !privateTypes.count(type)) {
      ensurePartition(type);
      continue;
    }

    switch (kind) {
      case Supertypes: {
        auto super = type.getDeclaredSuperType();
        if (super && shapeEq(type, *super)) {
          // The current type and its supertype have the same top-level
          // structure and are not distinguished, so add the current type to its
          // supertype's partition.
          auto it = ensurePartition(*super);
          it->push_back(makeDFAState(type));
          typePartitions[type] = it;
        } else {
          // Otherwise, create a new partition for this type.
          ensurePartition(type);
        }
        break;
      }
      case Siblings: {
        // Find or create a partition for this type's siblings of the same
        // shape.
        auto it = ensureShapePartition(type);
        it->push_back(makeDFAState(type));
        typePartitions[type] = it;
        break;
      }
    }
  }

#if TYPE_MERGING_DEBUG
  std::cerr << "Initial partitions (";
  switch (kind) {
    case Supertypes:
      std::cerr << "supertypes";
      break;
    case Siblings:
      std::cerr << "siblings";
      break;
  }
  std::cerr << "):\n";
  dumpPartitions();
#endif

  // Construct and refine the partitioned DFA.
  std::vector<Partition> dfa(std::make_move_iterator(partitions.begin()),
                             std::make_move_iterator(partitions.end()));
  auto refinedPartitions = DFA::refinePartitions(dfa);

#if TYPE_MERGING_DEBUG
  auto dumpRefinedPartitions = [&]() {
    size_t i = 0;
    for (auto& partition : refinedPartitions) {
      std::cerr << i++ << ": " << print(partition[0]) << "\n";
      for (size_t j = 1; j < partition.size(); ++j) {
        std::cerr << "   " << print(partition[j]) << "\n";
      }
      std::cerr << "\n";
    }
  };
  std::cerr << "Refined partitions:\n";
  dumpRefinedPartitions();
#endif

  if (kind == Supertypes) {
    // It's possible that a partition has been split such that a common ancestor
    // ended up in one of the new partitions, leaving unrelated types grouped
    // together in the other new partition. Since we are only supposed to be
    // merging types into their supertypes, merging such unrelated types would
    // be unsafe. Post-process the refined partitions to manually split any
    // partitions containing unrelated types.
    //
    // Normally splitting partitions like this would require re-running DFA
    // minimization afterward, but in this case it is not possible that the
    // manual splits cause types in any other partition to become
    // differentiatable. A type and its subtype cannot differ by referring to
    // different, unrelated types in the same position because then they would
    // not be in a valid subtype relationship.
    std::vector<std::vector<HeapType>> newPartitions;
    for (const auto& partitionTypes : refinedPartitions) {
      auto split = splitSupertypePartition(partitionTypes);
      newPartitions.insert(newPartitions.end(), split.begin(), split.end());
    }
    refinedPartitions = newPartitions;

#if TYPE_MERGING_DEBUG
    std::cerr << "Manually split partitions:\n";
    dumpRefinedPartitions();
#endif
  }

  // Merge each refined partition into a single type. We should only merge into
  // supertypes or siblings because if we try to merge into a subtype then we
  // will accidentally set that subtype to be its own supertype. Also keep track
  // of the remaining types.
  std::vector<HeapType> newMergeable;
  bool merged = false;
  for (const auto& partition : refinedPartitions) {
    auto target = mergeableSupertypesFirst(partition).front();
    newMergeable.push_back(target);
    for (auto type : partition) {
      if (type != target) {
        merges[type] = target;
        merged = true;
      }
    }
  }
  mergeable = std::move(newMergeable);

#if TYPE_MERGING_DEBUG
  std::cerr << "Merges:\n";
  std::unordered_map<HeapType, std::vector<HeapType>> mergees;
  for (auto& [mergee, target] : merges) {
    mergees[target].push_back(mergee);
  }
  for (auto& [target, types] : mergees) {
    std::cerr << "target: " << print(target) << "\n";
    for (auto type : types) {
      std::cerr << "  " << print(type) << "\n";
    }
    std::cerr << "\n";
  }
#endif // TYPE_MERGING_DEBUG

  return merged;
}